

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
nestl::impl::vector<int,_nestl::test::minimal_allocator<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::minimal_allocator<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  ulong n;
  int *piVar6;
  int *piStack_30;
  int **ppiStack_28;
  
  uVar5 = (long)this->m_end_of_storage - (long)this->m_start >> 2;
  n = uVar5 * 3 + 3 >> 1;
  if (n <= requiredCapacity) {
    n = requiredCapacity;
  }
  if (uVar5 < n) {
    piVar4 = test::minimal_allocator<int>::allocate<nestl::has_exceptions::exception_ptr_error>
                       ((minimal_allocator<int> *)this,err,n,(void *)0x0);
    if ((err->m_exception)._M_exception_object == (void *)0x0) {
      piVar2 = this->m_finish;
      piVar1 = this->m_start;
      piVar3 = piVar4;
      for (piVar6 = piVar1; piVar6 != piVar2; piVar6 = piVar6 + 1) {
        *piVar3 = *piVar6;
        piVar3 = piVar3 + 1;
      }
      ppiStack_28 = &piStack_30;
      piStack_30 = piVar4;
      operator_delete(piVar1);
      this->m_start = piVar4;
      this->m_finish = (pointer)(((long)piVar2 - (long)piVar1) + (long)piVar4);
      this->m_end_of_storage = piVar4 + n;
      operator_delete((void *)0x0);
    }
    return;
  }
  __assert_fail("newCapacity > capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                ,0x328,
                "void nestl::impl::vector<int, nestl::test::minimal_allocator<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::minimal_allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
               );
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}